

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# concurrentqueue.h
# Opt level: O3

void __thiscall
moodycamel::ConcurrentQueue<loop::MessageLoop::TaskInfo_*,_moodycamel::ConcurrentQueueDefaultTraits>
::ConcurrentQueue(ConcurrentQueue<loop::MessageLoop::TaskInfo_*,_moodycamel::ConcurrentQueueDefaultTraits>
                  *this,size_t capacity)

{
  long lVar1;
  
  (this->producerListTail)._M_b._M_p = (__pointer_type)0x0;
  (this->producerCount).super___atomic_base<unsigned_int>._M_i = 0;
  (this->initialBlockPoolIndex).super___atomic_base<unsigned_long>._M_i = 0;
  (this->freeList).freeListHead._M_b._M_p = (__pointer_type)0x0;
  lVar1 = 0x60;
  do {
    *(undefined8 *)((long)(this->initialImplicitProducerHashEntries)._M_elems + lVar1 + -0x58) = 0;
    lVar1 = lVar1 + 0x10;
  } while (lVar1 != 0x260);
  this->nextExplicitConsumerId = (__atomic_base<unsigned_int>)0x0;
  this->globalExplicitConsumerOffset = (__atomic_base<unsigned_int>)0x0;
  (this->implicitProducerHashResizeInProgress).super___atomic_flag_base._M_i = false;
  (this->implicitProducerHashCount).super___atomic_base<unsigned_long>._M_i = 0;
  (this->initialImplicitProducerHash).capacity = 0x20;
  (this->initialImplicitProducerHash).entries = (this->initialImplicitProducerHashEntries)._M_elems;
  lVar1 = 0x58;
  do {
    *(undefined8 *)((long)(this->initialImplicitProducerHashEntries)._M_elems + lVar1 + -0x58) = 0;
    lVar1 = lVar1 + 0x10;
  } while (lVar1 != 600);
  (this->initialImplicitProducerHash).prev = (ImplicitProducerHash *)0x0;
  (this->implicitProducerHash)._M_b._M_p = &this->initialImplicitProducerHash;
  populate_initial_block_list(this,((capacity >> 5) + 1) - (ulong)((capacity & 0x1f) == 0));
  return;
}

Assistant:

explicit ConcurrentQueue(size_t capacity = 6 * BLOCK_SIZE)
		: producerListTail(nullptr),
		producerCount(0),
		initialBlockPoolIndex(0),
		nextExplicitConsumerId(0),
		globalExplicitConsumerOffset(0)
	{
		implicitProducerHashResizeInProgress.clear(std::memory_order_relaxed);
		populate_initial_implicit_producer_hash();
		populate_initial_block_list(capacity / BLOCK_SIZE + ((capacity & (BLOCK_SIZE - 1)) == 0 ? 0 : 1));
		
#ifdef MOODYCAMEL_QUEUE_INTERNAL_DEBUG
		// Track all the producers using a fully-resolved typed list for
		// each kind; this makes it possible to debug them starting from
		// the root queue object (otherwise wacky casts are needed that
		// don't compile in the debugger's expression evaluator).
		explicitProducers.store(nullptr, std::memory_order_relaxed);
		implicitProducers.store(nullptr, std::memory_order_relaxed);
#endif
	}